

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_tracker_connection::on_timeout(udp_tracker_connection *this,error_code *ec)

{
  time_point ec_00;
  bool bVar1;
  element_type *peVar2;
  undefined8 uVar3;
  int local_68;
  seconds32 local_64;
  int local_60;
  seconds32 local_5c;
  error_code local_58 [2];
  undefined1 local_38 [8];
  shared_ptr<libtorrent::aux::request_callback> cb;
  int local_20;
  seconds32 local_1c;
  time_point local_18;
  error_code *ec_local;
  udp_tracker_connection *this_local;
  
  local_18.__d.__r = (duration)(duration)ec;
  ec_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  ec_00.__d.__r = local_18.__d.__r;
  if (bVar1) {
    local_20 = 0;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)&local_1c,&local_20);
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._0_4_ = 0x1e;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)
               ((long)&cb.
                       super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 4),
               (int *)&cb.
                       super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
    fail(this,(error_code *)ec_00.__d.__r,timer,"",local_1c,
         cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_);
  }
  else {
    tracker_connection::requester((tracker_connection *)local_38);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      tracker_connection::tracker_req(&this->super_tracker_connection);
      uVar3 = ::std::__cxx11::string::c_str();
      (*peVar2->_vptr_request_callback[7])(peVar2,"*** UDP_TRACKER [ timed out url: %s ]",uVar3);
    }
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (local_58,timed_out,(type *)0x0);
    local_60 = 0;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)&local_5c,&local_60);
    local_68 = 0x1e;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)&local_64,&local_68);
    fail(this,local_58,timer,"",local_5c,local_64);
    ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
              ((shared_ptr<libtorrent::aux::request_callback> *)local_38);
  }
  return;
}

Assistant:

void udp_tracker_connection::on_timeout(error_code const& ec)
	{
		if (ec)
		{
			fail(ec, operation_t::timer);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb) cb->debug_log("*** UDP_TRACKER [ timed out url: %s ]", tracker_req().url.c_str());
#endif
		fail(error_code(errors::timed_out), operation_t::timer);
	}